

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

void __thiscall FPalette::MakeGoodRemap(FPalette *this)

{
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  PalEntry sortcopy [256];
  undefined8 uStack_420;
  uint local_418 [258];
  
  aVar2 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->BaseColors[0].field_0.d;
  uVar7 = 1;
  do {
    if (this->BaseColors[uVar7].field_0.d == aVar2.d) {
      this->Remap[0] = (BYTE)uVar7;
      goto LAB_00492673;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x100);
  uVar7 = (ulong)this->Remap[0];
LAB_00492673:
  if ((char)uVar7 == '\0') {
    iVar10 = 0;
    iVar11 = 1;
    iVar12 = 2;
    iVar13 = 3;
    lVar8 = 0;
    do {
      paVar1 = &this->BaseColors[lVar8].field_0;
      uVar3 = paVar1[1].d;
      uVar4 = paVar1[2].d;
      uVar5 = paVar1[3].d;
      local_418[lVar8] = iVar10 << 0x18 | paVar1->d;
      local_418[lVar8 + 1] = iVar11 << 0x18 | uVar3;
      local_418[lVar8 + 2] = iVar12 << 0x18 | uVar4;
      local_418[lVar8 + 3] = iVar13 << 0x18 | uVar5;
      lVar8 = lVar8 + 4;
      iVar10 = iVar10 + 4;
      iVar11 = iVar11 + 4;
      iVar12 = iVar12 + 4;
      iVar13 = iVar13 + 4;
    } while (lVar8 != 0x100);
    uStack_420 = 0x4926cd;
    qsort(local_418,0x100,4,sortforremap);
    lVar8 = 0x3fc;
    do {
      if (lVar8 == 0) {
        return;
      }
      uVar3 = *(uint *)((long)&uStack_420 + lVar8 + 4);
      uVar4 = *(uint *)((long)local_418 + lVar8);
      lVar8 = lVar8 + -4;
    } while (((uVar3 ^ uVar4) & 0xffffff) != 0);
    bVar6 = (byte)(uVar4 >> 0x18);
    bVar9 = (byte)(uVar3 >> 0x18);
    uVar5 = uVar3 >> 0x18;
    if (bVar6 < bVar9) {
      uVar5 = uVar4 >> 0x18;
    }
    uVar4 = uVar4 >> 0x18;
    if (bVar6 <= bVar9) {
      uVar4 = uVar3 >> 0x18;
    }
    this->Remap[0] = (BYTE)uVar5;
    this->Remap[uVar5] = (BYTE)uVar4;
    this->BaseColors[uVar5].field_0.d = (uint32)aVar2;
  }
  return;
}

Assistant:

void FPalette::MakeGoodRemap ()
{
	PalEntry color0 = BaseColors[0];
	int i;

	// First try for an exact match of color 0. Only Hexen does not have one.
	for (i = 1; i < 256; ++i)
	{
		if (BaseColors[i] == color0)
		{
			Remap[0] = i;
			break;
		}
	}

	// If there is no duplicate of color 0, find the first set of duplicate
	// colors and make one of them a duplicate of color 0. In Hexen's PLAYPAL
	// colors 209 and 229 are the only duplicates, but we cannot assume
	// anything because the player might be using a custom PLAYPAL where those
	// entries are not duplicates.
	if (Remap[0] == 0)
	{
		PalEntry sortcopy[256];

		for (i = 0; i < 256; ++i)
		{
			sortcopy[i] = BaseColors[i] | (i << 24);
		}
		qsort (sortcopy, 256, 4, sortforremap);
		for (i = 255; i > 0; --i)
		{
			if ((sortcopy[i] & 0xFFFFFF) == (sortcopy[i-1] & 0xFFFFFF))
			{
				int new0 = sortcopy[i].a;
				int dup = sortcopy[i-1].a;
				if (new0 > dup)
				{
					// Make the lower-numbered entry a copy of color 0. (Just because.)
					swapvalues (new0, dup);
				}
				Remap[0] = new0;
				Remap[new0] = dup;
				BaseColors[new0] = color0;
				break;
			}
		}
	}

	// If there were no duplicates, InitPalette() will remap color 0 to the
	// closest matching color. Hopefully nobody will use a palette where all
	// 256 entries are different. :-)
}